

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
MapIRCCommand::trigger
          (MapIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  size_t sVar4;
  bool bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3;
  undefined8 *puVar6;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined8 *local_68;
  undefined8 *local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50 [2];
  
  pcVar3 = channel._M_str;
  sVar4 = channel._M_len;
  args_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)nick._M_str;
  lVar2 = Jupiter::IRC::Client::getChannel(source,sVar4,pcVar3,pcVar3,nick._M_len);
  if (lVar2 != 0) {
    Jupiter::IRC::Client::Channel::getType();
    RenX::getCore();
    RenX::Core::getServers();
    bVar5 = false;
    for (puVar6 = local_68; puVar6 != local_60; puVar6 = puVar6 + 1) {
      cVar1 = RenX::Server::isLogChanType((int)*puVar6);
      if (cVar1 != '\0') {
        lVar2 = RenX::Server::getMap();
        local_98._0_8_ = 0xd;
        local_98._8_8_ = "Current Map: ";
        local_a8._0_8_ = (pointer)0x8;
        local_a8._8_8_ = "; GUID: ";
        RenX::formatGUID_abi_cxx11_((Map *)local_50);
        jessilib::
        join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
                  (&local_88,(jessilib *)local_98,
                   (basic_string_view<char,_std::char_traits<char>_> *)(lVar2 + 0x10),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                   local_50,args_3);
        Jupiter::IRC::Client::sendMessage
                  (source,sVar4,pcVar3,local_88._M_string_length,local_88._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)local_50);
        bVar5 = true;
      }
    }
    std::_Vector_base<RenX::Server_*,_std::allocator<RenX::Server_*>_>::~_Vector_base
              ((_Vector_base<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)&local_68);
    if (!bVar5) {
      Jupiter::IRC::Client::sendMessage
                (source,sVar4,pcVar3,0x40,
                 "Error: Channel not attached to any connected Renegade X servers.");
    }
  }
  return;
}

Assistant:

void MapIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan != nullptr) {
		int type = chan->getType();
		bool match = false;
		for (const auto& server : RenX::getCore()->getServers()) {
			if (server->isLogChanType(type)) {
				match = true;
				const RenX::Map &map = server->getMap();
				source->sendMessage(channel, jessilib::join<std::string>("Current Map: "sv, map.name, "; GUID: "sv, RenX::formatGUID(map)));
			}
		}
		if (match == false) {
			source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		}
	}
}